

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O3

int add_cert_dir(BY_DIR *ctx,char *dir,int type)

{
  char *__s;
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  OPENSSL_STACK *pOVar6;
  CRYPTO_MUTEX *lock;
  char *pcVar7;
  char *pcVar8;
  ulong i;
  size_t sVar9;
  
  if ((dir == (char *)0x0) || (cVar1 = *dir, pcVar7 = dir, cVar1 == '\0')) {
    ERR_put_error(0xb,0,0x6e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                  ,0x90);
    return 0;
  }
  do {
    if ((cVar1 == ':') || (pcVar8 = pcVar7, cVar1 == '\0')) {
      pcVar8 = dir + 1;
      sVar9 = (long)dir - (long)pcVar7;
      if (sVar9 != 0) {
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
        i = 0;
        if (sVar3 != 0) {
          do {
            pvVar4 = OPENSSL_sk_value((OPENSSL_STACK *)ctx->dirs,i);
            __s = *(char **)((long)pvVar4 + 0x38);
            sVar5 = strlen(__s);
            if ((sVar5 == sVar9) && (iVar2 = strncmp(__s,pcVar7,sVar9), iVar2 == 0)) break;
            i = i + 1;
            sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
          } while (i < sVar3);
        }
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
        if (sVar3 <= i) {
          if (ctx->dirs == (stack_st_BY_DIR_ENTRY *)0x0) {
            pOVar6 = OPENSSL_sk_new_null();
            ctx->dirs = (stack_st_BY_DIR_ENTRY *)pOVar6;
            if (pOVar6 == (OPENSSL_STACK *)0x0) {
              return 0;
            }
          }
          lock = (CRYPTO_MUTEX *)OPENSSL_malloc(0x50);
          if (lock == (CRYPTO_MUTEX *)0x0) {
            return 0;
          }
          CRYPTO_MUTEX_init(lock);
          *(int *)((long)lock + 0x40) = type;
          pOVar6 = OPENSSL_sk_new(by_dir_hash_cmp);
          *(OPENSSL_STACK **)((long)lock + 0x48) = pOVar6;
          pcVar7 = OPENSSL_strndup(pcVar7,sVar9);
          lock[1].__align = (long)pcVar7;
          if (((pcVar7 == (char *)0x0) || (*(long *)((long)lock + 0x48) == 0)) ||
             (sVar9 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->dirs,lock), sVar9 == 0)) {
            by_dir_entry_free((BY_DIR_ENTRY *)&lock->__data);
            return 0;
          }
        }
      }
    }
    if (*dir == '\0') {
      return 1;
    }
    cVar1 = dir[1];
    dir = dir + 1;
    pcVar7 = pcVar8;
  } while( true );
}

Assistant:

static int add_cert_dir(BY_DIR *ctx, const char *dir, int type) {
  size_t j, len;
  const char *s, *ss, *p;

  if (dir == NULL || !*dir) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_DIRECTORY);
    return 0;
  }

  s = dir;
  p = s;
  do {
    if (*p == DIR_HASH_SEPARATOR || *p == '\0') {
      BY_DIR_ENTRY *ent;
      ss = s;
      s = p + 1;
      len = p - ss;
      if (len == 0) {
        continue;
      }
      for (j = 0; j < sk_BY_DIR_ENTRY_num(ctx->dirs); j++) {
        ent = sk_BY_DIR_ENTRY_value(ctx->dirs, j);
        if (strlen(ent->dir) == len && strncmp(ent->dir, ss, len) == 0) {
          break;
        }
      }
      if (j < sk_BY_DIR_ENTRY_num(ctx->dirs)) {
        continue;
      }
      if (ctx->dirs == NULL) {
        ctx->dirs = sk_BY_DIR_ENTRY_new_null();
        if (!ctx->dirs) {
          return 0;
        }
      }
      ent = reinterpret_cast<BY_DIR_ENTRY *>(
          OPENSSL_malloc(sizeof(BY_DIR_ENTRY)));
      if (!ent) {
        return 0;
      }
      CRYPTO_MUTEX_init(&ent->lock);
      ent->dir_type = type;
      ent->hashes = sk_BY_DIR_HASH_new(by_dir_hash_cmp);
      ent->dir = OPENSSL_strndup(ss, len);
      if (ent->dir == NULL || ent->hashes == NULL ||
          !sk_BY_DIR_ENTRY_push(ctx->dirs, ent)) {
        by_dir_entry_free(ent);
        return 0;
      }
    }
  } while (*p++ != '\0');
  return 1;
}